

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall cmComputeLinkInformation::AddItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  string *config;
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  size_t sVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  const_iterator cVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  cmGeneratorTarget *tgt;
  string exe;
  LinkEntry libEntry;
  cmGeneratorTarget *local_188;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_180;
  undefined1 local_150 [64];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  ItemIsPath local_ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  char *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  char local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  key_type local_a8;
  string local_88;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_68;
  FeatureDescriptor *local_38;
  
  local_188 = entry->Target;
  if (local_188 == (cmGeneratorTarget *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = cmGeneratorTarget::IsExecutableWithExports(local_188);
  }
  config = &this->Config;
  if (((bVar5 != false) && (bVar6 = cmGeneratorTarget::HasImportLibrary(local_188,config), !bVar6))
     && ((this->LoaderFlag).Value == (string *)0x0)) {
    return;
  }
  if ((local_188 == (cmGeneratorTarget *)0x0) ||
     (bVar6 = cmGeneratorTarget::IsLinkable(local_188), !bVar6)) {
    local_150._8_8_ = (entry->Feature)._M_dataplus._M_p;
    local_150._0_8_ = (entry->Feature)._M_string_length;
    if (((ulong)local_150._0_8_ < (pointer)0x9) ||
       (__str._M_str = "FRAMEWORK", __str._M_len = 9,
       iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_150,
                          (size_type)(local_150._0_8_ + -9),9,__str), iVar8 != 0)) {
      sVar3 = (entry->Feature)._M_string_length;
      if ((sVar3 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) &&
         (((sVar3 == 0 ||
           (iVar8 = bcmp((entry->Feature)._M_dataplus._M_p,
                         cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar3)
           , iVar8 == 0)) && (bVar5 = cmSystemTools::IsPathToFramework((string *)entry), bVar5)))) {
        this_00 = this->Makefile;
        local_150._0_8_ = local_150 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"APPLE","");
        bVar6 = cmMakefile::IsOn(this_00,(string *)local_150);
        bVar5 = true;
      }
      else {
        bVar5 = false;
        bVar6 = false;
      }
    }
    else {
      bVar5 = false;
      bVar6 = true;
    }
    if ((bVar5) && ((undefined1 *)local_150._0_8_ != local_150 + 0x10)) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    if (bVar6 != false) {
      AddFrameworkItem(this,entry);
      return;
    }
    bVar5 = cmsys::SystemTools::FileIsFullPath((string *)entry);
    if (!bVar5) {
      AddUserItem(this,entry,true);
      return;
    }
    bVar5 = cmsys::SystemTools::FileIsDirectory((string *)entry);
    if (bVar5) {
      DropDirectoryItem(this,&entry->Item);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,(value_type *)entry);
    AddFullItem(this,entry);
    AddLibraryRuntimeInfo(this,(string *)entry);
    return;
  }
  if ((bVar5 & (this->LoaderFlag).Value != (string *)0x0) == 1) {
    bVar5 = cmGeneratorTarget::HasImportLibrary(local_188,config);
    cmGeneratorTarget::GetFullPath(&local_180.Value,local_188,config,(uint)bVar5,true);
    local_c8 = &local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_180.Value._M_dataplus._M_p,
               local_180.Value._M_string_length + local_180.Value._M_dataplus._M_p);
    local_150._32_8_ =
         (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
         .
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_150._40_8_ =
         (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
         .
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count + 1;
      }
    }
    if (local_c8 == &local_b8) {
      local_150._24_8_ = uStack_b0;
      local_150._0_8_ = local_150 + 0x10;
    }
    else {
      local_150._0_8_ = local_c8;
    }
    local_150._17_7_ = uStack_b7;
    local_150[0x10] = local_b8;
    local_150._8_8_ = local_c0;
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    local_b8 = '\0';
    local_ec = Yes;
    sVar3 = (entry->Feature)._M_string_length;
    local_c8 = &local_b8;
    if ((sVar3 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) &&
       ((sVar3 == 0 ||
        (iVar8 = bcmp((entry->Feature)._M_dataplus._M_p,
                      cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar3),
        iVar8 == 0)))) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"__CMAKE_LINK_EXECUTABLE","");
    }
    else {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      pcVar4 = (entry->Feature)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)&local_a8,pcVar4,pcVar4 + sVar3);
    }
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,&local_a8);
    local_38 = (FeatureDescriptor *)0x0;
    if ((_Rb_tree_header *)cVar9._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_38 = (FeatureDescriptor *)(cVar9._M_node + 2);
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_150,&local_ec,&local_188,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_);
    }
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Depends,
               &local_180.Value);
  }
  else {
    TVar7 = cmGeneratorTarget::GetType(local_188);
    if (TVar7 != INTERFACE_LIBRARY) {
      TVar7 = cmGeneratorTarget::GetType(local_188);
      if (TVar7 == OBJECT_LIBRARY) {
        return;
      }
      bVar5 = cmGeneratorTarget::HasImportLibrary(local_188,config);
      cmGeneratorTarget::GetFullPath(&local_88,local_188,config,(uint)bVar5,true);
      local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      paVar2 = &local_180.Value.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == &local_88.field_2) {
        local_180.Value.field_2._8_8_ = local_88.field_2._8_8_;
        local_180.Value._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_180.Value._M_dataplus._M_p = local_88._M_dataplus._M_p;
      }
      local_180.Value.field_2._M_allocated_capacity._1_7_ =
           local_88.field_2._M_allocated_capacity._1_7_;
      local_180.Value.field_2._M_local_buf[0] = local_88.field_2._M_local_buf[0];
      local_180.Value._M_string_length = local_88._M_string_length;
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      bVar6 = cmTarget::IsAIX(local_188->Target);
      if (bVar6) {
        local_150._0_8_ = local_180.Value._M_string_length;
        local_150._8_8_ = local_180.Value._M_dataplus._M_p;
        if (local_180.Value._M_string_length < (pointer)0x9) {
          bVar6 = false;
        }
        else {
          __str_00._M_str = "-NOTFOUND";
          __str_00._M_len = 9;
          iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_150,
                             (size_type)(local_180.Value._M_string_length + -9),9,__str_00);
          bVar6 = iVar8 == 0;
        }
        if ((bVar5 & bVar6) != 0) {
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&local_180);
          return;
        }
      }
      if ((this->LinkDependsNoShared != true) ||
         (TVar7 = cmGeneratorTarget::GetType(local_188), TVar7 != SHARED_LIBRARY)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Depends,&local_180.Value);
      }
      pcVar4 = (entry->Item).Value._M_dataplus._M_p;
      local_150._0_8_ = local_150 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_150,pcVar4,pcVar4 + (entry->Item).Value._M_string_length);
      local_150._32_8_ =
           (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_150._40_8_ =
           (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count + 1;
        }
      }
      local_150._56_4_ = entry->Kind;
      local_150._48_8_ = entry->Target;
      pcVar4 = (entry->Feature)._M_dataplus._M_p;
      local_110._M_p = (pointer)&local_100;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar4,pcVar4 + (entry->Feature)._M_string_length);
      std::__cxx11::string::_M_assign((string *)local_150);
      local_150._32_8_ =
           local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 0x28),
                 &local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      AddTargetItem(this,(LinkEntry *)local_150);
      AddLibraryRuntimeInfo(this,&local_180.Value,local_188);
      if (((local_188 != (cmGeneratorTarget *)0x0) &&
          (TVar7 = cmGeneratorTarget::GetType(local_188), TVar7 == SHARED_LIBRARY)) &&
         (bVar5 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar5)) {
        AddRuntimeDLL(this,local_188);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_);
      }
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.Value._M_dataplus._M_p == paVar2) {
        return;
      }
      goto LAB_0037ba30;
    }
    pcVar1 = local_150 + 0x10;
    local_150._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_150._16_8_ = local_150._16_8_ & 0xffffffffffffff00;
    local_180.Value._M_dataplus._M_p = local_180.Value._M_dataplus._M_p & 0xffffffff00000000;
    local_150._0_8_ = pcVar1;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150,(ItemIsPath *)&local_180,&local_188);
    if ((char *)local_150._0_8_ != pcVar1) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    cmGeneratorTarget::GetImportedLibName(&local_180.Value,local_188,config);
    if ((pointer)local_180.Value._M_string_length != (pointer)0x0) {
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_180.Value._M_dataplus._M_p,
                 local_180.Value._M_string_length + local_180.Value._M_dataplus._M_p);
      local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      paVar2 = &local_68.Value.field_2;
      if (local_e8 == &local_d8) {
        local_68.Value.field_2._8_8_ = local_d8._8_8_;
        local_68.Value._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_68.Value._M_dataplus._M_p = (pointer)local_e8;
      }
      local_68.Value.field_2._M_allocated_capacity._1_7_ = local_d8._M_allocated_capacity._1_7_;
      local_68.Value.field_2._M_local_buf[0] = local_d8._M_local_buf[0];
      local_68.Value._M_string_length = local_e0;
      local_e0 = 0;
      local_d8._M_local_buf[0] = '\0';
      local_e8 = &local_d8;
      cmComputeLinkDepends::LinkEntry::LinkEntry
                ((LinkEntry *)local_150,&local_68,(cmGeneratorTarget *)0x0);
      AddItem(this,(LinkEntry *)local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_);
      }
      if ((char *)local_150._0_8_ != pcVar1) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.Value._M_dataplus._M_p != paVar2) {
        operator_delete(local_68.Value._M_dataplus._M_p,
                        local_68.Value.field_2._M_allocated_capacity + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,CONCAT71(local_d8._M_allocated_capacity._1_7_,
                                          local_d8._M_local_buf[0]) + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.Value._M_dataplus._M_p == &local_180.Value.field_2) {
    return;
  }
LAB_0037ba30:
  operator_delete(local_180.Value._M_dataplus._M_p,local_180.Value.field_2._M_allocated_capacity + 1
                 );
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(LinkEntry const& entry)
{
  cmGeneratorTarget const* tgt = entry.Target;
  BT<std::string> const& item = entry.Item;

  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !tgt->HasImportLibrary(config) && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now using a special feature.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      std::string exe = tgt->GetFullPath(config, artifact, true);
      this->Items.emplace_back(
        BT<std::string>(exe, item.Backtrace), ItemIsPath::Yes, tgt,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_EXECUTABLE"
                                   : entry.Feature));
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), ItemIsPath::No, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(BT<std::string>(libName, item.Backtrace));
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      // Ignore object library!
      // Its object-files should already have been extracted for linking.
    } else {
      // Decide whether to use an import library.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      BT<std::string> lib = BT<std::string>(
        tgt->GetFullPath(config, artifact, true), item.Backtrace);
      if (tgt->Target->IsAIX() && cmHasLiteralSuffix(lib.Value, "-NOTFOUND") &&
          artifact == cmStateEnums::ImportLibraryArtifact) {
        // This is an imported executable on AIX that has ENABLE_EXPORTS
        // but not IMPORTED_IMPLIB.  CMake used to produce and accept such
        // imported executables on AIX before we taught it to use linker
        // import files.  For compatibility, simply skip linking to this
        // executable as we did before.  It works with runtime linking.
        return;
      }
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib.Value);
      }

      LinkEntry libEntry{ entry };
      libEntry.Item = lib;
      this->AddTargetItem(libEntry);
      this->AddLibraryRuntimeInfo(lib.Value, tgt);
      if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
          this->Target->IsDLLPlatform()) {
        this->AddRuntimeDLL(tgt);
      }
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s) ||
        (entry.Feature == DEFAULT &&
         cmSystemTools::IsPathToFramework(item.Value) &&
         this->Makefile->IsOn("APPLE"))) {
      // This is a framework.
      this->AddFrameworkItem(entry);
    } else if (cmSystemTools::FileIsFullPath(item.Value)) {
      if (cmSystemTools::FileIsDirectory(item.Value)) {
        // This is a directory.
        this->DropDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item.Value);
        this->AddFullItem(entry);
        this->AddLibraryRuntimeInfo(item.Value);
      }
    } else {
      // This is a library or option specified by the user.
      this->AddUserItem(entry, true);
    }
  }
}